

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O3

void __thiscall
curlpp::CallbackException<curlpp::LogicError>::~CallbackException
          (CallbackException<curlpp::LogicError> *this)

{
  *(undefined ***)&(this->super_CallbackExceptionBase).super_RuntimeError =
       &PTR__CallbackException_00133c90;
  LogicError::~LogicError(&this->mException);
  RuntimeError::~RuntimeError((RuntimeError *)this);
  return;
}

Assistant:

class CURLPPAPI CallbackException : public CallbackExceptionBase
	{

	public: 

		typedef CallbackException<ExceptionType> _CE;

		CallbackException(const ExceptionType & e) 
			: mException(e)
		{}

		virtual void throwMe() 
		{
			throw mException;
		}

		virtual _CE * clone() 
		{
			return new _CE(*this);
		}

	private:

		ExceptionType mException;

	}